

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O1

bool __thiscall
S2MaxDistanceShapeIndexTarget::UpdateMinDistance
          (S2MaxDistanceShapeIndexTarget *this,S2Point *v0,S2Point *v1,S2MaxDistance *min_dist)

{
  double dVar1;
  Result RVar2;
  EdgeTarget target;
  Target local_48;
  double local_40;
  double dStack_38;
  double local_30;
  VType local_28;
  VType VStack_20;
  VType local_18;
  
  *(double *)
   &(((this->query_)._M_t.
      super___uniq_ptr_impl<S2FurthestEdgeQuery,_std::default_delete<S2FurthestEdgeQuery>_>._M_t.
      super__Tuple_impl<0UL,_S2FurthestEdgeQuery_*,_std::default_delete<S2FurthestEdgeQuery>_>.
      super__Head_base<0UL,_S2FurthestEdgeQuery_*,_false>._M_head_impl)->options_).super_Options =
       (min_dist->distance_).length2_;
  local_48._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_002c2710;
  local_30 = v0->c_[2];
  local_40 = v0->c_[0];
  dStack_38 = v0->c_[1];
  local_28 = v1->c_[0];
  VStack_20 = v1->c_[1];
  local_18 = v1->c_[2];
  dVar1 = local_30 * local_30 + dStack_38 * dStack_38 + local_40 * local_40;
  if (dVar1 < 0.0) {
    sqrt(dVar1);
  }
  dVar1 = local_18 * local_18 + VStack_20 * VStack_20 + local_28 * local_28;
  if (dVar1 < 0.0) {
    sqrt(dVar1);
  }
  local_48._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_002c1f18;
  RVar2 = S2FurthestEdgeQuery::FindFurthestEdge
                    ((this->query_)._M_t.
                     super___uniq_ptr_impl<S2FurthestEdgeQuery,_std::default_delete<S2FurthestEdgeQuery>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_S2FurthestEdgeQuery_*,_std::default_delete<S2FurthestEdgeQuery>_>
                     .super__Head_base<0UL,_S2FurthestEdgeQuery_*,_false>._M_head_impl,&local_48);
  if (-1 < RVar2.shape_id_) {
    (min_dist->distance_).length2_ = RVar2.distance_.length2_.length2_;
  }
  return -1 < RVar2.shape_id_;
}

Assistant:

bool S2MaxDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Point& v0, const S2Point& v1, S2MaxDistance* min_dist) {
  query_->mutable_options()->set_min_distance(S1ChordAngle(*min_dist));
  S2FurthestEdgeQuery::EdgeTarget target(v0, v1);
  S2FurthestEdgeQuery::Result r = query_->FindFurthestEdge(&target);
  if (r.shape_id() < 0) return false;
  *min_dist = S2MaxDistance(r.distance());
  return true;
}